

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

bool __thiscall Assembler::isInstruction(Assembler *this,string *line)

{
  bool bVar1;
  bool bVar2;
  bool local_109;
  string local_e8;
  byte local_c1;
  string local_c0;
  byte local_99;
  string local_98;
  byte local_71;
  string local_70;
  string local_40;
  string *local_20;
  string *line_local;
  Assembler *this_local;
  
  local_20 = line;
  line_local = &this->inputFileName;
  std::__cxx11::string::string((string *)&local_40,(string *)line);
  local_71 = 0;
  local_99 = 0;
  local_c1 = 0;
  bVar1 = false;
  bVar2 = checkIfNoOperand(this,&local_40);
  local_109 = true;
  if (!bVar2) {
    std::__cxx11::string::string((string *)&local_70,(string *)line);
    local_71 = 1;
    bVar2 = checkIfLdStr(this,&local_70);
    local_109 = true;
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_98,(string *)line);
      local_99 = 1;
      bVar2 = checkIfJump(this,&local_98);
      local_109 = true;
      if (!bVar2) {
        std::__cxx11::string::string((string *)&local_c0,(string *)line);
        local_c1 = 1;
        bVar2 = checkIfInstrWithTwoReg(this,&local_c0);
        local_109 = true;
        if (!bVar2) {
          std::__cxx11::string::string((string *)&local_e8,(string *)line);
          bVar1 = true;
          local_109 = checkIfOneOpReg(this,&local_e8);
        }
      }
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_e8);
  }
  if ((local_c1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if ((local_99 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((local_71 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&local_40);
  if (local_109 != false) {
    this->isLabelWithoutCode = false;
  }
  return local_109 != false;
}

Assistant:

bool Assembler::isInstruction(string line) {
    if (checkIfNoOperand(line) || checkIfLdStr(line) ||
        checkIfJump(line) || checkIfInstrWithTwoReg(line) || checkIfOneOpReg(line)) {
        isLabelWithoutCode = false;
        return true;
    } else return false;
}